

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

void AM_Drawer(void)

{
  bool bVar1;
  int iVar2;
  AInventory *pAVar3;
  AActor *this;
  AMColor *pAVar4;
  bool local_39;
  DVector3 local_38;
  double local_20;
  double vh;
  sector_t_conflict *sec;
  bool allthings;
  bool allmap;
  
  if (automapactive) {
    sec._7_1_ = (level.flags2 & 2) != 0;
    local_39 = false;
    if ((bool)sec._7_1_) {
      pAVar3 = AActor::FindInventory
                         ((AActor *)(&players)[(long)consoleplayer * 0x54],
                          (PClassActor *)APowerScanner::RegistrationInfo.MyClass,true);
      local_39 = pAVar3 != (AInventory *)0x0;
    }
    sec._6_1_ = local_39;
    bVar1 = FBoolCVar::operator_cast_to_bool(&am_portaloverlay);
    if (bVar1) {
      local_20 = *(double *)(&DAT_01ae7128 + (long)consoleplayer * 0x2a0);
      this = TObjPtr<AActor>::operator->
                       ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
      AActor::GetPortalTransition(&local_38,this,local_20,(sector_t **)&vh);
      MapPortalGroup = *(int *)((long)vh + 0x208);
    }
    else {
      MapPortalGroup = 0;
    }
    AM_initColors((bool)(viewactive & 1));
    if ((viewactive & 1U) == 0) {
      f_y = 0;
      f_x = 0;
      f_w = DCanvas::GetWidth((DCanvas *)screen);
      f_h = ST_Y;
      f_p = DCanvas::GetPitch((DCanvas *)screen);
      pAVar4 = AMColorset::operator[](&AMColors,0);
      AM_clearFB(pAVar4);
    }
    else {
      f_x = viewwindowx;
      f_y = viewwindowy;
      f_w = viewwidth;
      f_h = viewheight;
      f_p = DCanvas::GetPitch((DCanvas *)screen);
    }
    AM_activateNewScale();
    bVar1 = FBoolCVar::operator_cast_to_bool(&am_textured);
    if ((((bVar1) && ((hasglnodes & 1U) != 0)) && ((textured & 1U) != 0)) &&
       ((viewactive & 1U) == 0)) {
      AM_drawSubsectors();
    }
    if (grid != 0) {
      AM_drawGrid(0xf);
    }
    AM_drawWalls((bool)(sec._7_1_ & 1));
    AM_drawPlayers();
    iVar2 = G_SkillProperty(SKILLP_EasyKey);
    if (iVar2 != 0) {
      AM_drawKeys();
    }
    iVar2 = FIntCVar::operator_cast_to_int(&am_cheat);
    if (((1 < iVar2) && (iVar2 = FIntCVar::operator_cast_to_int(&am_cheat), iVar2 != 4)) ||
       ((sec._6_1_ & 1) != 0)) {
      AM_drawThings();
    }
    AM_drawAuthorMarkers();
    if ((viewactive & 1U) == 0) {
      pAVar4 = AMColorset::operator[](&AMColors,0x10);
      AM_drawCrosshair(pAVar4);
    }
    AM_drawMarks();
    AM_showSS();
  }
  return;
}

Assistant:

void AM_Drawer ()
{
	if (!automapactive)
		return;

	bool allmap = (level.flags2 & LEVEL2_ALLMAP) != 0;
	bool allthings = allmap && players[consoleplayer].mo->FindInventory(RUNTIME_CLASS(APowerScanner), true) != NULL;

	if (am_portaloverlay)
	{
		sector_t *sec;
		double vh = players[consoleplayer].viewheight;
		players[consoleplayer].camera->GetPortalTransition(vh, &sec);
		MapPortalGroup = sec->PortalGroup;
	}
	else MapPortalGroup = 0;
	AM_initColors (viewactive);

	if (!viewactive)
	{
		// [RH] Set f_? here now to handle automap overlaying
		// and view size adjustments.
		f_x = f_y = 0;
		f_w = screen->GetWidth ();
		f_h = ST_Y;
		f_p = screen->GetPitch ();

		AM_clearFB(AMColors[AMColors.Background]);
	}
	else 
	{
		f_x = viewwindowx;
		f_y = viewwindowy;
		f_w = viewwidth;
		f_h = viewheight;
		f_p = screen->GetPitch ();
	}
	AM_activateNewScale();

	if (am_textured && hasglnodes && textured && !viewactive)
		AM_drawSubsectors();

	if (grid)	
		AM_drawGrid(AMColors.GridColor);

	AM_drawWalls(allmap);
	AM_drawPlayers();
	if (G_SkillProperty(SKILLP_EasyKey))
		AM_drawKeys();
	if ((am_cheat >= 2 && am_cheat != 4) || allthings)
		AM_drawThings();

	AM_drawAuthorMarkers();

	if (!viewactive)
		AM_drawCrosshair(AMColors[AMColors.XHairColor]);

	AM_drawMarks();

	AM_showSS();
}